

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O0

bool __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Push
          (PageStack<Memory::MarkContext::MarkCandidate> *this,MarkCandidate item)

{
  MarkCandidate *pMVar1;
  code *pcVar2;
  bool bVar3;
  Chunk *pCVar4;
  undefined8 *in_FS_OFFSET;
  Chunk *newChunk;
  PageStack<Memory::MarkContext::MarkCandidate> *this_local;
  MarkCandidate item_local;
  
  if (this->nextEntry == this->chunkEnd) {
    pCVar4 = CreateChunk(this);
    if (pCVar4 == (Chunk *)0x0) {
      return false;
    }
    pCVar4->nextChunk = this->currentChunk;
    this->currentChunk = pCVar4;
    this->chunkStart = (MarkCandidate *)(this->currentChunk + 1);
    this->chunkEnd = (MarkCandidate *)(this->currentChunk + 0x80);
    this->nextEntry = this->chunkStart;
  }
  if ((this->nextEntry < this->chunkStart) || (this->chunkEnd <= this->nextEntry)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x84,"(nextEntry >= chunkStart && nextEntry < chunkEnd)",
                       "nextEntry >= chunkStart && nextEntry < chunkEnd");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pMVar1 = this->nextEntry;
  pMVar1->obj = item.obj;
  pMVar1->byteCount = item.byteCount;
  this->nextEntry = this->nextEntry + 1;
  this->count = this->count + 1;
  if (this->count !=
      ((long)this->nextEntry - (long)this->chunkStart >> 4) + (this->pageCount - 1) * 0xfe) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x8b,
                       "(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk)",
                       "count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return true;
}

Assistant:

inline
bool PageStack<T>::Push(T item)
{
    if (nextEntry == chunkEnd)
    {
        Chunk * newChunk = CreateChunk();
        if (newChunk == nullptr)
        {
            return false;
        }

        newChunk->nextChunk = currentChunk;
        currentChunk = newChunk;

        chunkStart = currentChunk->entries;
        chunkEnd = &currentChunk->entries[EntriesPerChunk];
        nextEntry = chunkStart;
    }

    Assert(nextEntry >= chunkStart && nextEntry < chunkEnd);

    *nextEntry = item;
    nextEntry++;

#if DBG
    count++;
    Assert(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk);
#endif

    return true;
}